

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

int __thiscall Assimp::ColladaParser::GetAttribute(ColladaParser *this,char *pAttr)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  char *local_1b8;
  char *local_1b0;
  string local_1a8;
  ostringstream local_188 [376];
  
  local_1b8 = pAttr;
  iVar1 = TestAttribute(this,pAttr);
  if (iVar1 != -1) {
    return iVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Expected attribute \"",0x14);
  poVar2 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_188
                      ,&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" for element <",0xf);
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  local_1b0 = (char *)CONCAT44(extraout_var,iVar1);
  poVar2 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar2,
                      &local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,">.",2);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1a8);
}

Assistant:

int ColladaParser::GetAttribute(const char* pAttr) const {
    int index = TestAttribute(pAttr);
    if (index != -1) {
        return index;
    }

    // attribute not found -> throw an exception
    ThrowException(format() << "Expected attribute \"" << pAttr << "\" for element <" << mReader->getNodeName() << ">.");
    return -1;
}